

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUIImage * __thiscall
irr::gui::CGUIEnvironment::addImage
          (CGUIEnvironment *this,ITexture *image,vector2d<int> pos,bool useAlphaChannel,
          IGUIElement *parent,s32 id,wchar_t *text)

{
  rect<int> rectangle;
  dimension2d<unsigned_int> *other;
  IGUIImage *pIVar1;
  byte in_CL;
  ITexture *in_RSI;
  long in_RDI;
  IReferenceCounted *in_R8;
  undefined4 in_R9D;
  long in_stack_00000008;
  IGUIImage *img;
  dimension2d<int> sz;
  undefined4 in_stack_ffffffffffffff80;
  IReferenceCounted *local_78;
  IGUIElement *in_stack_ffffffffffffffa0;
  IGUIEnvironment *in_stack_ffffffffffffffa8;
  CGUIImage *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  dimension2d<int> in_stack_ffffffffffffffbc;
  int iVar2;
  int local_38;
  dimension2d<int> local_34;
  undefined4 local_2c;
  IReferenceCounted *local_28;
  byte local_19;
  ITexture *local_18;
  
  local_19 = in_CL & 1;
  local_38 = 0;
  iVar2 = 0;
  local_2c = in_R9D;
  local_28 = in_R8;
  local_18 = in_RSI;
  core::dimension2d<int>::dimension2d(&local_34,&local_38,(int *)&stack0xffffffffffffffc4);
  if (local_18 != (ITexture *)0x0) {
    other = video::ITexture::getOriginalSize(local_18);
    core::dimension2d<int>::dimension2d<unsigned_int>
              ((dimension2d<int> *)&stack0xffffffffffffffbc,other);
  }
  pIVar1 = (IGUIImage *)operator_new(0x188);
  if (local_28 == (IReferenceCounted *)0x0) {
    local_78 = (IReferenceCounted *)(in_RDI + 8);
  }
  else {
    local_78 = local_28;
  }
  core::rect<int>::rect<int>
            ((rect<int> *)CONCAT44(local_2c,in_stack_ffffffffffffff80),(vector2d<int> *)local_78,
             (dimension2d<int> *)0x3ae563);
  rectangle.UpperLeftCorner.Y = in_stack_ffffffffffffffbc.Width;
  rectangle.LowerRightCorner.X = in_stack_ffffffffffffffbc.Height;
  rectangle.UpperLeftCorner.X = in_stack_ffffffffffffffb8;
  rectangle.LowerRightCorner.Y = iVar2;
  CGUIImage::CGUIImage
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (s32)((ulong)in_RDI >> 0x20),rectangle);
  if (in_stack_00000008 != 0) {
    (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x14])
              (pIVar1,in_stack_00000008);
  }
  if ((local_19 & 1) != 0) {
    (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x28])(pIVar1,1);
  }
  if (local_18 != (ITexture *)0x0) {
    (*(pIVar1->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x24])(pIVar1,local_18);
  }
  IReferenceCounted::drop(local_78);
  return pIVar1;
}

Assistant:

IGUIImage *CGUIEnvironment::addImage(video::ITexture *image, core::position2d<s32> pos,
		bool useAlphaChannel, IGUIElement *parent, s32 id, const wchar_t *text)
{
	core::dimension2d<s32> sz(0, 0);
	if (image)
		sz = core::dimension2d<s32>(image->getOriginalSize());

	IGUIImage *img = new CGUIImage(this, parent ? parent : this,
			id, core::rect<s32>(pos, sz));

	if (text)
		img->setText(text);

	if (useAlphaChannel)
		img->setUseAlphaChannel(true);

	if (image)
		img->setImage(image);

	img->drop();
	return img;
}